

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

void xercesc_4_0::XMLUri::isConformantUserInfo(XMLCh *userInfo,MemoryManager *manager)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  MalformedURLException *pMVar4;
  XMLCh local_28;
  undefined2 local_26;
  undefined2 local_24;
  undefined2 local_22;
  XMLCh value1 [4];
  XMLCh *tmpStr;
  MemoryManager *manager_local;
  XMLCh *userInfo_local;
  
  value1 = (XMLCh  [4])userInfo;
  if (userInfo != (XMLCh *)0x0) {
    while (*(short *)value1 != 0) {
      bVar1 = isUnreservedCharacter(*(XMLCh *)value1);
      if ((bVar1) ||
         (iVar2 = XMLString::indexOf((XMLCh *)USERINFO_CHARACTERS,*(XMLCh *)value1), iVar2 != -1)) {
        value1 = (XMLCh  [4])((long)value1 + 2);
      }
      else {
        if (*(short *)value1 != 0x25) {
          pMVar4 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x5b7,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_USERINFO,userInfo,
                     (XMLCh *)0x0,(XMLCh *)0x0,manager);
          __cxa_throw(pMVar4,&MalformedURLException::typeinfo,
                      MalformedURLException::~MalformedURLException);
        }
        XVar3 = XMLString::stringLen((XMLCh *)value1);
        if (((XVar3 < 3) || (bVar1 = XMLString::isHex(*(XMLCh *)((long)value1 + 2)), !bVar1)) ||
           (bVar1 = XMLString::isHex(*(XMLCh *)((long)value1 + 4)), !bVar1)) {
          local_28 = L'%';
          local_26 = *(undefined2 *)((long)value1 + 2);
          local_24 = *(undefined2 *)((long)value1 + 4);
          local_22 = 0;
          pMVar4 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x5ae,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_USERINFO,
                     &local_28,(XMLCh *)0x0,(XMLCh *)0x0,manager);
          __cxa_throw(pMVar4,&MalformedURLException::typeinfo,
                      MalformedURLException::~MalformedURLException);
        }
        value1 = (XMLCh  [4])((long)value1 + 6);
      }
    }
  }
  return;
}

Assistant:

void XMLUri::isConformantUserInfo(const XMLCh* const userInfo
                                  , MemoryManager* const manager)
{
	if ( !userInfo )
        return;

    const XMLCh* tmpStr = userInfo;
    while (*tmpStr)
    {
        if ( isUnreservedCharacter(*tmpStr) ||
            (XMLString::indexOf(USERINFO_CHARACTERS, *tmpStr) != -1))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >= 3
                && XMLString::isHex(*(tmpStr+1))     // 1st hex
                && XMLString::isHex(*(tmpStr+2))  )  // 2nd hex
            {
                tmpStr+=3;
            }
            else
            {
                XMLCh value1[4];
                value1[0] = chPercent;
                value1[1] = *(tmpStr+1);
                value1[2] = *(tmpStr+2);
                value1[3] = chNull;

                ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                        , errMsg_USERINFO
                        , value1
                        , manager);
            }
        }
        else
        {
            ThrowXMLwithMemMgr2(MalformedURLException
                    , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                    , errMsg_USERINFO
                    , userInfo
                    , manager);
        }
    } //while

    return;
}